

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_sinusoidal_modeling_to_autocorrelation.cc
# Opt level: O1

bool __thiscall
sptk::CompositeSinusoidalModelingToAutocorrelation::Run
          (CompositeSinusoidalModelingToAutocorrelation *this,
          vector<double,_std::allocator<double>_> *composite_sinusoidal_modeling,
          vector<double,_std::allocator<double>_> *autocorrelation)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  uint uVar5;
  bool bVar6;
  ulong uVar7;
  size_type __new_size;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar6 = false;
  if (autocorrelation != (vector<double,_std::allocator<double>_> *)0x0) {
    iVar2 = this->num_sine_wave_;
    uVar5 = iVar2 * 2;
    __new_size = (size_type)(int)uVar5;
    bVar6 = false;
    if ((long)(composite_sinusoidal_modeling->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(composite_sinusoidal_modeling->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3 == __new_size) {
      if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(autocorrelation,__new_size);
      }
      bVar6 = true;
      if (0 < iVar2) {
        pdVar3 = (composite_sinusoidal_modeling->super__Vector_base<double,_std::allocator<double>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar2 = this->num_sine_wave_;
        pdVar4 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = 1;
        if (1 < (int)uVar5) {
          uVar8 = (ulong)uVar5;
        }
        uVar7 = 0;
        do {
          if (this->num_sine_wave_ < 1) {
            dVar10 = 0.0;
          }
          else {
            dVar10 = 0.0;
            lVar9 = 0;
            do {
              dVar1 = pdVar3[iVar2 + lVar9];
              dVar11 = cos(pdVar3[lVar9] * (double)(int)uVar7);
              dVar10 = dVar10 + dVar11 * dVar1;
              lVar9 = lVar9 + 1;
            } while (lVar9 < this->num_sine_wave_);
          }
          pdVar4[uVar7] = dVar10;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar8);
        bVar6 = true;
      }
    }
  }
  return bVar6;
}

Assistant:

bool CompositeSinusoidalModelingToAutocorrelation::Run(
    const std::vector<double>& composite_sinusoidal_modeling,
    std::vector<double>* autocorrelation) const {
  // Check inputs.
  const int length(num_sine_wave_ * 2);
  if (!is_valid_ ||
      composite_sinusoidal_modeling.size() !=
          static_cast<std::size_t>(length) ||
      NULL == autocorrelation) {
    return false;
  }

  // Prepare memories.
  if (autocorrelation->size() != static_cast<std::size_t>(length)) {
    autocorrelation->resize(length);
  }

  const double* frequencies(&(composite_sinusoidal_modeling[0]));
  const double* intensities(&(composite_sinusoidal_modeling[num_sine_wave_]));
  double* v(&((*autocorrelation)[0]));

  // Calculate autocorrelation using Eq. (2).
  for (int l(0); l < length; ++l) {
    double sum(0.0);
    for (int i(0); i < num_sine_wave_; ++i) {
      sum += intensities[i] * std::cos(l * frequencies[i]);
    }
    v[l] = sum;
  }

  return true;
}